

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::FCDUTF16CollationIterator::FCDUTF16CollationIterator
          (FCDUTF16CollationIterator *this,FCDUTF16CollationIterator *other,UChar *newText)

{
  char cVar1;
  ushort uVar2;
  UChar *pUVar3;
  int iVar4;
  char16_t *pcVar5;
  UChar *pUVar6;
  
  CollationIterator::CollationIterator((CollationIterator *)this,(CollationIterator *)other);
  (this->super_UTF16CollationIterator).start = (UChar *)0x0;
  (this->super_UTF16CollationIterator).pos = (UChar *)0x0;
  (this->super_UTF16CollationIterator).limit = (UChar *)0x0;
  (this->super_UTF16CollationIterator).super_CollationIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16CollationIterator_00472bd8;
  this->rawStart = newText;
  this->segmentStart =
       (UChar *)(((long)other->segmentStart - (long)other->rawStart) + (long)newText);
  pUVar6 = (UChar *)(((long)other->segmentLimit - (long)other->rawStart) + (long)newText);
  if (other->segmentLimit == (UChar *)0x0) {
    pUVar6 = (UChar *)0x0;
  }
  this->segmentLimit = pUVar6;
  pUVar6 = (UChar *)(((long)other->rawLimit - (long)other->rawStart) + (long)newText);
  if (other->rawLimit == (UChar *)0x0) {
    pUVar6 = (UChar *)0x0;
  }
  this->rawLimit = pUVar6;
  this->nfcImpl = other->nfcImpl;
  icu_63::UnicodeString::UnicodeString(&this->normalized,&other->normalized);
  cVar1 = other->checkDir;
  this->checkDir = cVar1;
  pUVar6 = (other->super_UTF16CollationIterator).start;
  if ((cVar1 == '\0') && (pUVar6 != other->segmentStart)) {
    uVar2 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar2 & 0x11) == 0) {
      if ((uVar2 & 2) == 0) {
        pcVar5 = (this->normalized).fUnion.fFields.fArray;
      }
      else {
        pcVar5 = (this->normalized).fUnion.fStackFields.fBuffer;
      }
    }
    else {
      pcVar5 = (char16_t *)0x0;
    }
    (this->super_UTF16CollationIterator).start = pcVar5;
    (this->super_UTF16CollationIterator).pos =
         (UChar *)(((long)(other->super_UTF16CollationIterator).pos -
                   (long)(other->super_UTF16CollationIterator).start) + (long)pcVar5);
    if ((short)uVar2 < 0) {
      iVar4 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    pcVar5 = pcVar5 + iVar4;
  }
  else {
    pUVar3 = other->rawStart;
    (this->super_UTF16CollationIterator).start =
         (UChar *)(((long)pUVar6 - (long)pUVar3) + (long)newText);
    (this->super_UTF16CollationIterator).pos =
         (UChar *)(((long)(other->super_UTF16CollationIterator).pos - (long)pUVar3) + (long)newText)
    ;
    pUVar6 = (other->super_UTF16CollationIterator).limit;
    pcVar5 = (char16_t *)(((long)pUVar6 - (long)other->rawStart) + (long)newText);
    if (pUVar6 == (UChar *)0x0) {
      pcVar5 = (char16_t *)0x0;
    }
  }
  (this->super_UTF16CollationIterator).limit = pcVar5;
  return;
}

Assistant:

FCDUTF16CollationIterator::FCDUTF16CollationIterator(const FCDUTF16CollationIterator &other,
                                                     const UChar *newText)
        : UTF16CollationIterator(other),
          rawStart(newText),
          segmentStart(newText + (other.segmentStart - other.rawStart)),
          segmentLimit(other.segmentLimit == NULL ? NULL : newText + (other.segmentLimit - other.rawStart)),
          rawLimit(other.rawLimit == NULL ? NULL : newText + (other.rawLimit - other.rawStart)),
          nfcImpl(other.nfcImpl),
          normalized(other.normalized),
          checkDir(other.checkDir) {
    if(checkDir != 0 || other.start == other.segmentStart) {
        start = newText + (other.start - other.rawStart);
        pos = newText + (other.pos - other.rawStart);
        limit = other.limit == NULL ? NULL : newText + (other.limit - other.rawStart);
    } else {
        start = normalized.getBuffer();
        pos = start + (other.pos - other.start);
        limit = start + normalized.length();
    }
}